

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthMux(uint *pOut,uint *pCof0,uint *pCof1,int nVars,int iVar)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x268,
                  "void Extra_TruthMux(unsigned int *, unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pOut[uVar7] = pCof1[uVar7] & 0xaaaaaaaa | pCof0[uVar7] & 0x55555555;
    }
    break;
  case 1:
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pOut[uVar7] = pCof1[uVar7] & 0xcccccccc | pCof0[uVar7] & 0x33333333;
    }
    break;
  case 2:
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pOut[uVar7] = pCof1[uVar7] & 0xf0f0f0f0 | pCof0[uVar7] & 0xf0f0f0f;
    }
    break;
  case 3:
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pOut[uVar7] = pCof1[uVar7] & 0xff00ff00 | pCof0[uVar7] & 0xff00ff;
    }
    break;
  case 4:
    uVar7 = 0;
    uVar6 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar6 = uVar7;
    }
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pOut[uVar7] = CONCAT22(*(undefined2 *)((long)pCof1 + uVar7 * 4 + 2),(short)pCof0[uVar7]);
    }
    break;
  default:
    bVar2 = (char)iVar - 5;
    uVar5 = 1 << (bVar2 & 0x1f);
    iVar1 = 2 << (bVar2 & 0x1f);
    iVar3 = 0;
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    for (; iVar3 < (int)uVar4; iVar3 = iVar3 + iVar1) {
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        pOut[uVar7] = pCof0[uVar7];
        pOut[(long)(int)uVar5 + uVar7] = pCof1[(long)(int)uVar5 + uVar7];
      }
      pOut = pOut + iVar1;
    }
  }
  return;
}

Assistant:

void Extra_TruthMux( unsigned * pOut, unsigned * pCof0, unsigned * pCof1, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x55555555) | (pCof1[i] & 0xAAAAAAAA);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x33333333) | (pCof1[i] & 0xCCCCCCCC);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0F0F0F0F) | (pCof1[i] & 0xF0F0F0F0);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x00FF00FF) | (pCof1[i] & 0xFF00FF00);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0000FFFF) | (pCof1[i] & 0xFFFF0000);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pOut[i]      = pCof0[i];
                pOut[Step+i] = pCof1[Step+i];
            }
            pOut += 2*Step;
        }
        return;
    }
}